

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O0

void anon_unknown.dwarf_47f3d::testRandomAngles44(void)

{
  float *pfVar1;
  float a;
  float c;
  double dVar2;
  double dVar3;
  double dVar4;
  int k;
  int j_2;
  int j_1;
  V3f s;
  int j;
  V3f h;
  V3f r;
  V3f t;
  M44f M;
  int i;
  Rand48 random;
  unsigned_long in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  Matrix44<float> local_cc;
  int local_8c;
  int local_88;
  int local_84;
  float in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Matrix44<float> *in_stack_ffffffffffffff90;
  Vec3<float> local_64;
  Vec3<float> local_58;
  Vec3<float> local_4c [2];
  M44f *in_stack_ffffffffffffffd0;
  int local_c;
  
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
  for (local_c = 0; local_c < 100000; local_c = local_c + 1) {
    Imath_3_2::Matrix44<float>::Matrix44((Matrix44<float> *)local_4c);
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff20 = (float)dVar2;
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff1c = (float)dVar2;
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    Imath_3_2::Vec3<float>::Vec3
              (&local_58,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(float)dVar2);
    Imath_3_2::Matrix44<float>::translate<float>((Matrix44<float> *)local_4c,&local_58);
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    a = rad((float)dVar2);
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff24 = rad((float)dVar2);
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    c = rad((float)dVar2);
    Imath_3_2::Vec3<float>::Vec3(&local_64,a,in_stack_ffffffffffffff24,c);
    Imath_3_2::Matrix44<float>::rotate<float>
              (in_stack_ffffffffffffff90,
               (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    dVar3 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    dVar4 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    Imath_3_2::Vec3<float>::Vec3
              ((Vec3<float> *)&stack0xffffffffffffff90,(float)dVar2,(float)dVar3,(float)dVar4);
    for (in_stack_ffffffffffffff8c = 0; in_stack_ffffffffffffff8c < 3;
        in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c + 1) {
      dVar2 = Imath_3_2::Rand48::nextf
                        ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      if (0.5 <= dVar2) {
        pfVar1 = Imath_3_2::Vec3<float>::operator[]
                           ((Vec3<float> *)&stack0xffffffffffffff90,in_stack_ffffffffffffff8c);
        *pfVar1 = *pfVar1 * -1.0;
      }
    }
    Imath_3_2::Matrix44<float>::shear<float>
              ((Matrix44<float> *)local_4c,(Vec3<float> *)&stack0xffffffffffffff90);
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff18 = (float)dVar2;
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff14 = (float)dVar2;
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    Imath_3_2::Vec3<float>::Vec3
              ((Vec3<float> *)&stack0xffffffffffffff80,in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff14,(float)dVar2);
    for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
      dVar2 = Imath_3_2::Rand48::nextf
                        ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      if (0.5 <= dVar2) {
        pfVar1 = Imath_3_2::Vec3<float>::operator[]
                           ((Vec3<float> *)&stack0xffffffffffffff80,local_84);
        *pfVar1 = *pfVar1 * -1.0;
      }
    }
    Imath_3_2::Matrix44<float>::scale<float>
              ((Matrix44<float> *)local_4c,(Vec3<float> *)&stack0xffffffffffffff80);
    for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
      for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
        dVar2 = Imath_3_2::Rand48::nextf
                          ((Rand48 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        in_stack_ffffffffffffff10 = (float)dVar2;
        pfVar1 = Imath_3_2::Matrix44<float>::operator[]((Matrix44<float> *)local_4c,local_88);
        pfVar1[local_8c] = in_stack_ffffffffffffff10 + pfVar1[local_8c];
      }
    }
    Imath_3_2::Matrix44<float>::Matrix44(&local_cc,(Matrix44<float> *)local_4c);
    testMatrix(in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void
testRandomAngles44 ()
{
    Rand48 random (0);

    for (int i = 0; i < 100000; ++i)
    {
        debug (("iteration: %d\n", i));

        M44f M;

        //
        // Translate M.
        //

        V3f t (
            float(random.nextf (-10, 10)),
            float(random.nextf (-10, 10)),
            float(random.nextf (-10, 10)));

        M.translate (t);

        //
        // Rotate M.
        //

        V3f r (
            rad (float(random.nextf (-180, 180))),
            rad (float(random.nextf (-180, 180))),
            rad (float(random.nextf (-180, 180))));

        M.rotate (r);

        //
        // Shear M.
        //

        V3f h (
            float(random.nextf (0.000001, 2.0)),
            float(random.nextf (0.000001, 2.0)),
            float(random.nextf (0.000001, 2.0)));

        for (int j = 0; j < 3; j++)
            if (random.nextf (0.0, 1.0) >= 0.5) h[j] *= -1;

        M.shear (h);

        //
        // Scale M.
        //

        V3f s (
            float(random.nextf (0.000001, 2.0)),
            float(random.nextf (0.000001, 2.0)),
            float(random.nextf (0.000001, 2.0)));

        for (int j = 0; j < 3; j++)
            if (random.nextf (0.0, 1.0) >= 0.5) s[j] *= -1;

        M.scale (s);

        //
        // Add a small random error to the elements of M
        //

        for (int j = 0; j < 4; ++j)
            for (int k = 0; k < 3; ++k)
                M[j][k] += float(random.nextf (-1e-7, 1e-7));

        debug (("Scale   : %f %f %f\n", s[0], s[1], s[2]));
        debug (("Shear   : %f %f %f\n", h[0], h[1], h[2]));
        debug (("Rot     : %f %f %f\n", r[0], r[1], r[2]));
        debug (("Trans   : %f %f %f\n", t[0], t[1], t[2]));

        //
        // Extract Euler angles from M, convert the Euler angles
        // back to a matrix, N, and verify that the entries in M
        // and N do not differ too much.
        //

        testMatrix (M);

        debug (("\n"));
    }
}